

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredRendering.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderLayeredRendering::iterate(GeometryShaderLayeredRendering *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *pTVar6;
  TestLog *this_01;
  MessageBuilder *pMVar7;
  undefined8 in_stack_ffffffffffffec18;
  uint uVar8;
  GLuint local_1328;
  GLuint local_1324;
  GLuint local_1320;
  GLuint local_131c;
  MessageBuilder local_12f0;
  int *local_1170;
  uchar *data_ptr;
  undefined4 local_1160;
  GLuint dst_fbo_id;
  GLuint new_dst_to;
  GLenum texture_target;
  bool texture_layered;
  int *piStack_1150;
  uint n;
  uchar *expected_data;
  uint local_1140;
  GLuint texture_id;
  uint n_layer;
  GLuint program_id;
  uchar buffer [4096];
  uint local_130;
  GLint provoking_vertex_index_uniform_location;
  uint test_index;
  GLint layer_provoking_vertex_uniform_value;
  GLint layer_provoking_vertex_gl_value;
  uint local_114;
  undefined4 local_110;
  uint n_current_test;
  uint n_twodimensionalma_vs_parts;
  uint n_twodimensionalma_gs_parts;
  uint n_twodimensionalma_fs_parts;
  uint n_twodimensionala_vs_parts;
  uint n_twodimensionala_gs_parts;
  uint n_twodimensionala_fs_parts;
  uint n_threedimensional_vs_parts;
  uint n_threedimensional_gs_parts;
  uint n_threedimensional_fs_parts;
  uint n_cm_vs_parts;
  uint n_cm_gs_parts;
  uint n_cm_fs_parts;
  char *twodimensionalma_vs_parts [1];
  char *twodimensionalma_gs_parts [3];
  char *local_b8;
  char *twodimensionalma_fs_parts [1];
  char *twodimensionala_vs_parts [1];
  char *twodimensionala_gs_parts [3];
  char *local_88;
  char *twodimensionala_fs_parts [1];
  char *threedimensional_vs_parts [1];
  char *threedimensional_gs_parts [3];
  char *local_58;
  char *threedimensional_fs_parts [1];
  char *cm_vs_parts [1];
  char *cm_gs_parts [3];
  char *local_28;
  char *cm_fs_parts [1];
  Functions *gl;
  GeometryShaderLayeredRendering *this_local;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  cm_fs_parts[0] = (char *)CONCAT44(extraout_var,iVar2);
  local_28 = m_layered_rendering_fs_code;
  cm_vs_parts[0] = m_layered_rendering_gs_code_preamble;
  threedimensional_fs_parts[0] = m_layered_rendering_vs_code;
  local_58 = m_layered_rendering_fs_code;
  threedimensional_vs_parts[0] = m_layered_rendering_gs_code_preamble;
  twodimensionala_fs_parts[0] = m_layered_rendering_vs_code;
  local_88 = m_layered_rendering_fs_code;
  twodimensionala_vs_parts[0] = m_layered_rendering_gs_code_preamble;
  twodimensionalma_fs_parts[0] = m_layered_rendering_vs_code;
  local_b8 = m_layered_rendering_fs_code;
  twodimensionalma_vs_parts[0] = m_layered_rendering_gs_code_preamble;
  _n_cm_gs_parts = m_layered_rendering_vs_code;
  n_cm_vs_parts = 1;
  n_threedimensional_fs_parts = 3;
  n_threedimensional_gs_parts = 1;
  n_threedimensional_vs_parts = 1;
  n_twodimensionala_fs_parts = 3;
  n_twodimensionala_gs_parts = 1;
  n_twodimensionala_vs_parts = 1;
  n_twodimensionalma_fs_parts = 3;
  n_twodimensionalma_gs_parts = 1;
  n_twodimensionalma_vs_parts = 1;
  n_current_test = 3;
  local_110 = 1;
  local_114 = 0;
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
               ,0xfc);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  this->m_tests[3].iteration = LAYERED_RENDERING_TEST_ITERATION_CUBEMAP;
  this->m_tests[3].n_layers = 6;
  this->m_tests[3].fs_parts = &local_28;
  this->m_tests[3].gs_parts = cm_vs_parts;
  this->m_tests[3].vs_parts = threedimensional_fs_parts;
  this->m_tests[3].n_fs_parts = 1;
  this->m_tests[3].n_gs_parts = 3;
  this->m_tests[3].n_vs_parts = 1;
  this->m_tests[0].iteration = LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY;
  this->m_tests[0].n_layers = 4;
  this->m_tests[0].fs_parts = &local_88;
  this->m_tests[0].gs_parts = twodimensionala_vs_parts;
  this->m_tests[0].vs_parts = twodimensionalma_fs_parts;
  this->m_tests[0].n_fs_parts = 1;
  this->m_tests[0].n_gs_parts = 3;
  this->m_tests[0].n_vs_parts = 1;
  this->m_tests[2].iteration = LAYERED_RENDERING_TEST_ITERATION_3D;
  this->m_tests[2].n_layers = 4;
  this->m_tests[2].fs_parts = &local_58;
  this->m_tests[2].gs_parts = threedimensional_vs_parts;
  this->m_tests[2].vs_parts = twodimensionala_fs_parts;
  this->m_tests[2].n_fs_parts = 1;
  this->m_tests[2].n_gs_parts = 3;
  this->m_tests[2].n_vs_parts = 1;
  this->m_tests[1].iteration = LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY;
  this->m_tests[1].n_layers = 4;
  this->m_tests[1].fs_parts = &local_b8;
  this->m_tests[1].gs_parts = twodimensionalma_vs_parts;
  this->m_tests[1].vs_parts = (char **)&n_cm_gs_parts;
  this->m_tests[1].n_fs_parts = 1;
  this->m_tests[1].n_gs_parts = 3;
  this->m_tests[1].n_vs_parts = 1;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))(0x8b30);
  this->m_tests[3].fs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_tests[3].gs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))(0x8b31);
  this->m_tests[3].vs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))(0x8b30);
  this->m_tests[0].fs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_tests[0].gs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))(0x8b31);
  this->m_tests[0].vs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))(0x8b30);
  this->m_tests[2].fs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_tests[2].gs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))(0x8b31);
  this->m_tests[2].vs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))(0x8b30);
  this->m_tests[1].fs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))
                    ((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_tests[1].gs_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3f0))(0x8b31);
  this->m_tests[1].vs_id = GVar3;
  dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
  glu::checkError(dVar4,"Could not create shaders!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                  ,0x137);
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3c8))();
  this->m_tests[3].po_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3c8))();
  this->m_tests[0].po_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3c8))();
  this->m_tests[2].po_id = GVar3;
  GVar3 = (**(code **)(cm_fs_parts[0] + 0x3c8))();
  this->m_tests[1].po_id = GVar3;
  dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
  glu::checkError(dVar4,"Could not create programs!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                  ,0x140);
  bVar1 = buildProgramForLRTest(this,this->m_tests + 3);
  if ((((bVar1) && (bVar1 = buildProgramForLRTest(this,this->m_tests), bVar1)) &&
      (bVar1 = buildProgramForLRTest(this,this->m_tests + 2), bVar1)) &&
     (bVar1 = buildProgramForLRTest(this,this->m_tests + 1), bVar1)) {
    test_index = 0xffffffff;
    (**(code **)(cm_fs_parts[0] + 0x868))
              ((this->super_TestCaseBase).m_glExtTokens.LAYER_PROVOKING_VERTEX,&test_index);
    dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                    ,0x150);
    if (test_index == (this->super_TestCaseBase).m_glExtTokens.FIRST_VERTEX_CONVENTION) {
      provoking_vertex_index_uniform_location = 1;
    }
    else if (test_index == (this->super_TestCaseBase).m_glExtTokens.LAST_VERTEX_CONVENTION) {
      provoking_vertex_index_uniform_location = 2;
    }
    else {
      if (test_index != (this->super_TestCaseBase).m_glExtTokens.UNDEFINED_VERTEX) {
        pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar6,
                   "Unrecognized value returned by glGetIntegerv() for GL_LAYER_PROVOKING_VERTEX_EXT pname."
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                   ,0x160);
        __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      provoking_vertex_index_uniform_location = 0;
    }
    for (local_130 = 0; uVar8 = (uint)((ulong)in_stack_ffffffffffffec18 >> 0x20), local_130 < 4;
        local_130 = local_130 + 1) {
      buffer._4092_4_ =
           (**(code **)(cm_fs_parts[0] + 0xb48))
                     (this->m_tests[local_130].po_id,"provoking_vertex_index");
      dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
      glu::checkError(dVar4,"glGetUniformLocation() call generated an error",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                      ,0x169);
      (**(code **)(cm_fs_parts[0] + 0x1080))
                (this->m_tests[local_130].po_id,buffer._4092_4_,
                 provoking_vertex_index_uniform_location);
      dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
      glu::checkError(dVar4,"glProgramUniform1i() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                      ,0x170);
    }
    (**(code **)(cm_fs_parts[0] + 0x6f8))(1,&this->m_tests[3].to_id);
    (**(code **)(cm_fs_parts[0] + 0x6f8))(1,&this->m_tests[0].to_id);
    (**(code **)(cm_fs_parts[0] + 0x6f8))(1,&this->m_tests[2].to_id);
    (**(code **)(cm_fs_parts[0] + 0x6f8))(1,&this->m_tests[1].to_id);
    dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
    glu::checkError(dVar4,"Could not create texture object(s)!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                    ,0x179);
    (**(code **)(cm_fs_parts[0] + 0xb8))(0x8513,this->m_tests[3].to_id);
    (**(code **)(cm_fs_parts[0] + 0x1380))(0x8513,1,0x8058,0x20);
    (**(code **)(cm_fs_parts[0] + 0xb8))(0x8c1a,this->m_tests[0].to_id);
    (**(code **)(cm_fs_parts[0] + 0x1398))(0x8c1a,1,0x8058,0x20,0x20,0x40);
    (**(code **)(cm_fs_parts[0] + 0xb8))(0x806f,this->m_tests[2].to_id);
    (**(code **)(cm_fs_parts[0] + 0x1398))(0x806f,1,0x8058,0x20,0x20,0x40);
    (**(code **)(cm_fs_parts[0] + 0xb8))(0x9102,this->m_tests[1].to_id);
    (**(code **)(cm_fs_parts[0] + 0x13a8))(0x9102,1,0x8058,0x20,0x20,0x40,(ulong)uVar8 << 0x20);
    dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
    glu::checkError(dVar4,"Could not initialize texture object(s)!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                    ,0x189);
    (**(code **)(cm_fs_parts[0] + 0x6d0))(1,this->m_tests + 3);
    (**(code **)(cm_fs_parts[0] + 0x6d0))(1,this->m_tests);
    (**(code **)(cm_fs_parts[0] + 0x6d0))(1,this->m_tests + 2);
    (**(code **)(cm_fs_parts[0] + 0x6d0))(1,this->m_tests + 1);
    dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
    glu::checkError(dVar4,"Could not create framebuffer object(s)!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                    ,0x191);
    (**(code **)(cm_fs_parts[0] + 0x78))(0x8ca9,this->m_tests[3].fbo_id);
    (**(code **)(cm_fs_parts[0] + 0x690))(0x8ca9,0x8ce0,this->m_tests[3].to_id,0);
    (**(code **)(cm_fs_parts[0] + 0x78))(0x8ca9,this->m_tests[0].fbo_id);
    (**(code **)(cm_fs_parts[0] + 0x690))(0x8ca9,0x8ce0,this->m_tests[0].to_id,0);
    (**(code **)(cm_fs_parts[0] + 0x78))(0x8ca9,this->m_tests[2].fbo_id);
    (**(code **)(cm_fs_parts[0] + 0x690))(0x8ca9,0x8ce0,this->m_tests[2].to_id,0);
    (**(code **)(cm_fs_parts[0] + 0x78))(0x8ca9,this->m_tests[1].fbo_id);
    (**(code **)(cm_fs_parts[0] + 0x690))(0x8ca9,0x8ce0,this->m_tests[1].to_id,0);
    dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
    glu::checkError(dVar4,"Could not configure framebuffer object(s)!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                    ,0x1a3);
    (**(code **)(cm_fs_parts[0] + 0x708))(1,&this->m_vao_id);
    (**(code **)(cm_fs_parts[0] + 0xd8))(this->m_vao_id);
    dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
    glu::checkError(dVar4,"Could not bind a vertex array object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                    ,0x1ab);
    local_114 = 0;
    do {
      if (3 < local_114) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      memset(&n_layer,0,0x1000);
      texture_id = 0;
      local_1140 = 0;
      expected_data._4_4_ = 0;
      (**(code **)(cm_fs_parts[0] + 0x78))(0x8d40,this->m_tests[local_114].fbo_id);
      texture_id = this->m_tests[local_114].po_id;
      expected_data._4_4_ = this->m_tests[local_114].to_id;
      (**(code **)(cm_fs_parts[0] + 0x1c0))(0x3f800000,0x3f800000,0x3f800000);
      (**(code **)(cm_fs_parts[0] + 0x188))(0x4000);
      (**(code **)(cm_fs_parts[0] + 0x1680))(texture_id);
      (**(code **)(cm_fs_parts[0] + 0x538))(0,0,1);
      dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
      glu::checkError(dVar4,"Error rendering geometry!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                      ,0x1c6);
      for (local_1140 = 0; local_1140 < this->m_tests[local_114].n_layers;
          local_1140 = local_1140 + 1) {
        piStack_1150 = (int *)(m_layered_rendering_expected_layer_data + (local_1140 << 2));
        texture_target = 0;
        new_dst_to._3_1_ = 0;
        dst_fbo_id = 0;
        switch(this->m_tests[local_114].iteration) {
        case LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY:
          new_dst_to._3_1_ = '\x01';
          dst_fbo_id = 0x8c1a;
          break;
        case LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY:
          new_dst_to._3_1_ = '\x01';
          dst_fbo_id = 0x9102;
          break;
        case LAYERED_RENDERING_TEST_ITERATION_3D:
          new_dst_to._3_1_ = '\x01';
          dst_fbo_id = 0x806f;
          break;
        case LAYERED_RENDERING_TEST_ITERATION_CUBEMAP:
          new_dst_to._3_1_ = '\0';
          if (local_1140 == 0) {
            local_131c = 0x8515;
          }
          else {
            if (local_1140 == 1) {
              local_1320 = 0x8516;
            }
            else {
              if (local_1140 == 2) {
                local_1324 = 0x8517;
              }
              else {
                if (local_1140 == 3) {
                  local_1328 = 0x8518;
                }
                else {
                  local_1328 = 0x851a;
                  if (local_1140 == 4) {
                    local_1328 = 0x8519;
                  }
                }
                local_1324 = local_1328;
              }
              local_1320 = local_1324;
            }
            local_131c = local_1320;
          }
          dst_fbo_id = local_131c;
          break;
        default:
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"This location should never be reached",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                     ,0x1fd);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        if (new_dst_to._3_1_ == '\0') {
          if ((((dst_fbo_id != 0x8515) && (dst_fbo_id != 0x8517)) &&
              ((dst_fbo_id != 0x8519 && ((dst_fbo_id != 0x8516 && (dst_fbo_id != 0x8518)))))) &&
             (dst_fbo_id != 0x851a)) {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,"This location should never be reached",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                       ,0x217);
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          (**(code **)(cm_fs_parts[0] + 0x6a0))(0x8ca8,0x8ce0,dst_fbo_id,expected_data._4_4_,0);
        }
        else {
          (**(code **)(cm_fs_parts[0] + 0x6b8))(0x8ca8,0x8ce0,expected_data._4_4_,0,local_1140);
        }
        dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
        glu::checkError(dVar4,"Error setting read framebuffer!",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                        ,0x21c);
        if (this->m_tests[local_114].iteration ==
            LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY) {
          local_1160 = 0;
          data_ptr._4_4_ = 0;
          (**(code **)(cm_fs_parts[0] + 0x6d0))(1,(long)&data_ptr + 4);
          (**(code **)(cm_fs_parts[0] + 0x78))(0x8ca8,this->m_tests[local_114].fbo_id);
          (**(code **)(cm_fs_parts[0] + 0x78))(0x8ca9,data_ptr._4_4_);
          (**(code **)(cm_fs_parts[0] + 0x6f8))(1,&local_1160);
          (**(code **)(cm_fs_parts[0] + 0xb8))(0xde1,local_1160);
          (**(code **)(cm_fs_parts[0] + 0x1380))(0xde1,1,0x8058,0x20);
          dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
          glu::checkError(dVar4,
                          "Could not setup texture object for draw framebuffer color attachment.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                          ,0x22e);
          (**(code **)(cm_fs_parts[0] + 0x6a0))(0x8ca9,0x8ce0,0xde1,local_1160,0);
          dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
          glu::checkError(dVar4,
                          "Could not attach texture object to draw framebuffer color attachment.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                          ,0x233);
          (**(code **)(cm_fs_parts[0] + 0x140))(0,0,0x20,0x20,0,0,0x20,0x20,0x4000,0x2601);
          dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
          glu::checkError(dVar4,"Error blitting from read framebuffer to draw framebuffer.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                          ,0x238);
          (**(code **)(cm_fs_parts[0] + 0x78))(0x8ca8,data_ptr._4_4_);
          (**(code **)(cm_fs_parts[0] + 0x1220))(0,0,0x20);
          dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
          glu::checkError(dVar4,"Error reading attachment\'s data!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                          ,0x23e);
          (**(code **)(cm_fs_parts[0] + 0x78))(0x8d40,this->m_tests[local_114].fbo_id);
          (**(code **)(cm_fs_parts[0] + 0x440))(1,(long)&data_ptr + 4);
          (**(code **)(cm_fs_parts[0] + 0x480))(1);
        }
        else {
          (**(code **)(cm_fs_parts[0] + 0x1220))(0,0,0x20,0x20,0x1908,0x1401,&n_layer);
          dVar4 = (**(code **)(cm_fs_parts[0] + 0x800))();
          glu::checkError(dVar4,"Error reading attachment\'s data!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
                          ,0x249);
        }
        for (; texture_target < 0x400; texture_target = texture_target + 1) {
          local_1170 = (int *)((long)&n_layer + (ulong)(texture_target << 2));
          if (*local_1170 != *piStack_1150) {
            this_01 = tcu::TestContext::getLog
                                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)
            ;
            tcu::TestLog::operator<<
                      (&local_12f0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar7 = tcu::MessageBuilder::operator<<(&local_12f0,(char (*) [16])0x2b06bcd);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uchar *)local_1170);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uchar *)((long)local_1170 + 1));
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uchar *)((long)local_1170 + 2));
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(uchar *)((long)local_1170 + 3));
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,(char (*) [37])"] is different from reference data [");
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,m_layered_rendering_expected_layer_data)
            ;
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,m_layered_rendering_expected_layer_data + 1);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,m_layered_rendering_expected_layer_data + 2);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x2a3caab);
            pMVar7 = tcu::MessageBuilder::operator<<
                               (pMVar7,m_layered_rendering_expected_layer_data + 3);
            pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [4])0x2aed711);
            tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_12f0);
            tcu::TestContext::setTestResult
                      ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                       QP_TEST_RESULT_FAIL,"Fail");
            return STOP;
          }
        }
      }
      local_114 = local_114 + 1;
    } while( true );
  }
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Could not create a program for cube-map texture layered rendering test!",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredRendering.cpp"
             ,0x148);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredRendering::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Helper variables to support shader compilation process */
	const char* cm_fs_parts[] = { m_layered_rendering_fs_code };
	const char* cm_gs_parts[] = { m_layered_rendering_gs_code_preamble, m_layered_rendering_gs_code_cm,
								  m_layered_rendering_gs_code_main };
	const char* cm_vs_parts[]				= { m_layered_rendering_vs_code };
	const char* threedimensional_fs_parts[] = { m_layered_rendering_fs_code };
	const char* threedimensional_gs_parts[] = { m_layered_rendering_gs_code_preamble, m_layered_rendering_gs_code_3d,
												m_layered_rendering_gs_code_main };
	const char* threedimensional_vs_parts[] = { m_layered_rendering_vs_code };
	const char* twodimensionala_fs_parts[]  = { m_layered_rendering_fs_code };
	const char* twodimensionala_gs_parts[]  = { m_layered_rendering_gs_code_preamble,
											   m_layered_rendering_gs_code_2d_array, m_layered_rendering_gs_code_main };
	const char* twodimensionala_vs_parts[]  = { m_layered_rendering_vs_code };
	const char* twodimensionalma_fs_parts[] = { m_layered_rendering_fs_code };
	const char* twodimensionalma_gs_parts[] = { m_layered_rendering_gs_code_preamble,
												m_layered_rendering_gs_code_2d_marray,
												m_layered_rendering_gs_code_main };
	const char*		   twodimensionalma_vs_parts[] = { m_layered_rendering_vs_code };
	const unsigned int n_cm_fs_parts			   = sizeof(cm_fs_parts) / sizeof(cm_fs_parts[0]);
	const unsigned int n_cm_gs_parts			   = sizeof(cm_gs_parts) / sizeof(cm_gs_parts[0]);
	const unsigned int n_cm_vs_parts			   = sizeof(cm_vs_parts) / sizeof(cm_vs_parts[0]);
	const unsigned int n_threedimensional_fs_parts =
		sizeof(threedimensional_fs_parts) / sizeof(threedimensional_fs_parts[0]);
	const unsigned int n_threedimensional_gs_parts =
		sizeof(threedimensional_gs_parts) / sizeof(threedimensional_gs_parts[0]);
	const unsigned int n_threedimensional_vs_parts =
		sizeof(threedimensional_vs_parts) / sizeof(threedimensional_vs_parts[0]);
	const unsigned int n_twodimensionala_fs_parts =
		sizeof(twodimensionala_fs_parts) / sizeof(twodimensionala_fs_parts[0]);
	const unsigned int n_twodimensionala_gs_parts =
		sizeof(twodimensionala_gs_parts) / sizeof(twodimensionala_gs_parts[0]);
	const unsigned int n_twodimensionala_vs_parts =
		sizeof(twodimensionala_vs_parts) / sizeof(twodimensionala_vs_parts[0]);
	const unsigned int n_twodimensionalma_fs_parts =
		sizeof(twodimensionalma_fs_parts) / sizeof(twodimensionalma_fs_parts[0]);
	const unsigned int n_twodimensionalma_gs_parts =
		sizeof(twodimensionalma_gs_parts) / sizeof(twodimensionalma_gs_parts[0]);
	const unsigned int n_twodimensionalma_vs_parts =
		sizeof(twodimensionalma_vs_parts) / sizeof(twodimensionalma_vs_parts[0]);

	/* General-use helper variables */
	unsigned int n_current_test = 0;

	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Configure test descriptors */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].iteration  = LAYERED_RENDERING_TEST_ITERATION_CUBEMAP;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].n_layers   = 6; /* faces */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].fs_parts   = cm_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].gs_parts   = cm_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].vs_parts   = cm_vs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].n_fs_parts = n_cm_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].n_gs_parts = n_cm_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].n_vs_parts = n_cm_vs_parts;

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].iteration  = LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].n_layers   = 4; /* layers */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].fs_parts   = twodimensionala_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].gs_parts   = twodimensionala_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].vs_parts   = twodimensionala_vs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].n_fs_parts = n_twodimensionala_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].n_gs_parts = n_twodimensionala_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].n_vs_parts = n_twodimensionala_vs_parts;

	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].iteration  = LAYERED_RENDERING_TEST_ITERATION_3D;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].n_layers   = 4; /* layers */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].fs_parts   = threedimensional_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].gs_parts   = threedimensional_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].vs_parts   = threedimensional_vs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].n_fs_parts = n_threedimensional_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].n_gs_parts = n_threedimensional_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].n_vs_parts = n_threedimensional_vs_parts;

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].iteration =
		LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].n_layers   = 4; /* layers */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].fs_parts   = twodimensionalma_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].gs_parts   = twodimensionalma_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].vs_parts   = twodimensionalma_vs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].n_fs_parts = n_twodimensionalma_fs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].n_gs_parts = n_twodimensionalma_gs_parts;
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].n_vs_parts = n_twodimensionalma_vs_parts;

	/* Create shader objects we'll use for the test */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].vs_id = gl.createShader(GL_VERTEX_SHADER);

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].vs_id = gl.createShader(GL_VERTEX_SHADER);

	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].vs_id = gl.createShader(GL_VERTEX_SHADER);

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].gs_id =
		gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shaders!");

	/* Create program objects as well */
	m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].po_id  = gl.createProgram();
	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].po_id = gl.createProgram();
	m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].po_id		 = gl.createProgram();

	m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create programs!");

	/* Build the programs */
	if (!buildProgramForLRTest(&m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP]) ||
		!buildProgramForLRTest(&m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY]) ||
		!buildProgramForLRTest(&m_tests[LAYERED_RENDERING_TEST_ITERATION_3D]) ||
		!buildProgramForLRTest(&m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY]))
	{
		TCU_FAIL("Could not create a program for cube-map texture layered rendering test!");
	}

	/* Set up provoking vertex uniform value, given the GL_LAYER_PROVOKING_VERTEX_EXT value. */
	glw::GLint layer_provoking_vertex_gl_value		= -1;
	glw::GLint layer_provoking_vertex_uniform_value = -1;

	gl.getIntegerv(m_glExtTokens.LAYER_PROVOKING_VERTEX, &layer_provoking_vertex_gl_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_LAYER_PROVOKING_VERTEX_EXT pname");

	if ((glw::GLenum)layer_provoking_vertex_gl_value == m_glExtTokens.FIRST_VERTEX_CONVENTION)
	{
		layer_provoking_vertex_uniform_value = 1; /* as per geometry shader implementation */
	}
	else if ((glw::GLenum)layer_provoking_vertex_gl_value == m_glExtTokens.LAST_VERTEX_CONVENTION)
	{
		layer_provoking_vertex_uniform_value = 2; /* as per geometry shader implementation */
	}
	else if ((glw::GLenum)layer_provoking_vertex_gl_value == m_glExtTokens.UNDEFINED_VERTEX)
	{
		layer_provoking_vertex_uniform_value = 0; /* as per geometry shader implementation */
	}
	else
	{
		TCU_FAIL("Unrecognized value returned by glGetIntegerv() for GL_LAYER_PROVOKING_VERTEX_EXT pname.");
	}

	for (unsigned int test_index = 0; test_index < LAYERED_RENDERING_TEST_ITERATION_LAST; ++test_index)
	{
		glw::GLint provoking_vertex_index_uniform_location =
			gl.getUniformLocation(m_tests[test_index].po_id, "provoking_vertex_index");

		/* Sanity checks */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call generated an error");
		DE_ASSERT(provoking_vertex_index_uniform_location != -1);

		/* Assign the uniform value */
		gl.programUniform1i(m_tests[test_index].po_id, provoking_vertex_index_uniform_location,
							layer_provoking_vertex_uniform_value);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glProgramUniform1i() call failed.");
	} /* for (all test iterations) */

	/* Initialize texture objects */
	gl.genTextures(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].to_id);
	gl.genTextures(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].to_id);
	gl.genTextures(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].to_id);
	gl.genTextures(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].to_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create texture object(s)!");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].to_id);
	gl.texStorage2D(GL_TEXTURE_CUBE_MAP, 1 /* mip-map only */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT);

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].to_id);
	gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1 /* mip-map only */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH);

	gl.bindTexture(GL_TEXTURE_3D, m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].to_id);
	gl.texStorage3D(GL_TEXTURE_3D, 1 /* mip-map only */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH);

	gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES,
				   m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].to_id);
	gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES, 1 /* samples */, GL_RGBA8, TEXTURE_WIDTH,
							   TEXTURE_HEIGHT, TEXTURE_DEPTH, GL_FALSE /* fixed sample locations */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not initialize texture object(s)!");

	/* Initialize framebuffer objects */
	gl.genFramebuffers(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].fbo_id);
	gl.genFramebuffers(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].fbo_id);
	gl.genFramebuffers(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].fbo_id);
	gl.genFramebuffers(1, &m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].fbo_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create framebuffer object(s)!");

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].fbo_id);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
						  m_tests[LAYERED_RENDERING_TEST_ITERATION_CUBEMAP].to_id, 0 /* base mip-map */);

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].fbo_id);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
						  m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY].to_id, 0 /* base mip-map */);

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].fbo_id);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_tests[LAYERED_RENDERING_TEST_ITERATION_3D].to_id,
						  0 /* base mip-map */);

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].fbo_id);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
						  m_tests[LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY].to_id, 0 /* base mip-map */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure framebuffer object(s)!");

	/* Initialize vertex array object. We don't really use any attributes, but ES does not
	 * permit draw calls with an unbound VAO
	 */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a vertex array object!");

	/* Execute all iterations */
	for (n_current_test = 0; n_current_test < sizeof(m_tests) / sizeof(m_tests[0]); ++n_current_test)
	{
		unsigned char buffer[TEXTURE_WIDTH * TEXTURE_HEIGHT * TEXTURE_N_COMPONENTS] = { 0 };
		glw::GLuint   program_id													= 0;
		unsigned int  n_layer														= 0;
		glw::GLuint   texture_id													= 0;

		/* Bind the iteration-specific framebuffer */
		gl.bindFramebuffer(GL_FRAMEBUFFER, m_tests[n_current_test].fbo_id);

		program_id = m_tests[n_current_test].po_id;
		texture_id = m_tests[n_current_test].to_id;

		/* Clear the color attachment with (1, 1, 1, 1) which is not used for
		 * any layers.
		 */
		gl.clearColor(1.0f, 1.0f, 1.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);

		/* Render a single point. This should result in full-screen quads drawn
		 * for each face/layer of the attachment bound to current FBO */
		gl.useProgram(program_id);
		gl.drawArrays(GL_POINTS, 0 /* first index */, 1 /* n points */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error rendering geometry!");

		/* Read contents of each layer we rendered to and verify the contents */
		for (n_layer = 0; n_layer < m_tests[n_current_test].n_layers; ++n_layer)
		{
			const unsigned char* expected_data =
				m_layered_rendering_expected_layer_data + TEXTURE_N_COMPONENTS * n_layer;
			unsigned int n				 = 0;
			bool		 texture_layered = false;
			glw::GLenum  texture_target  = GL_NONE;

			/* What is the source attachment's texture target? */
			switch (m_tests[n_current_test].iteration)
			{
			case LAYERED_RENDERING_TEST_ITERATION_CUBEMAP:
			{
				texture_layered = false;
				texture_target  = (n_layer == 0) ?
									 GL_TEXTURE_CUBE_MAP_POSITIVE_X :
									 (n_layer == 1) ?
									 GL_TEXTURE_CUBE_MAP_NEGATIVE_X :
									 (n_layer == 2) ? GL_TEXTURE_CUBE_MAP_POSITIVE_Y :
													  (n_layer == 3) ? GL_TEXTURE_CUBE_MAP_NEGATIVE_Y :
																	   (n_layer == 4) ? GL_TEXTURE_CUBE_MAP_POSITIVE_Z :
																						GL_TEXTURE_CUBE_MAP_NEGATIVE_Z;

				break;
			}

			case LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY:
			{
				texture_layered = true;
				texture_target  = GL_TEXTURE_2D_MULTISAMPLE_ARRAY_OES;

				break;
			}

			case LAYERED_RENDERING_TEST_ITERATION_3D:
			{
				texture_layered = true;
				texture_target  = GL_TEXTURE_3D;

				break;
			}

			case LAYERED_RENDERING_TEST_ITERATION_2D_ARRAY:
			{
				texture_layered = true;
				texture_target  = GL_TEXTURE_2D_ARRAY;

				break;
			}

			default:
			{
				TCU_FAIL("This location should never be reached");
			}
			}

			/* Configure the read framebuffer's read buffer, depending on whether the attachment
			 * uses layers or not
			 */
			if (texture_layered)
			{
				gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture_id, 0 /* base mip-map */,
										   n_layer);
			}
			else
			{
				if (texture_target == GL_TEXTURE_CUBE_MAP_POSITIVE_X ||
					texture_target == GL_TEXTURE_CUBE_MAP_POSITIVE_Y ||
					texture_target == GL_TEXTURE_CUBE_MAP_POSITIVE_Z ||
					texture_target == GL_TEXTURE_CUBE_MAP_NEGATIVE_X ||
					texture_target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Y ||
					texture_target == GL_TEXTURE_CUBE_MAP_NEGATIVE_Z)
				{
					gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, texture_target, texture_id,
											0 /* base mip-map */);
				}
				else
				{
					TCU_FAIL("This location should never be reached");
				}
			}

			/* Make sure read framebuffer was configured successfully */
			GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting read framebuffer!");

			/* Read the data */
			if (m_tests[n_current_test].iteration == LAYERED_RENDERING_TEST_ITERATION_2D_MULTISAMPLE_ARRAY)
			{
				glw::GLuint new_dst_to = 0;
				glw::GLuint dst_fbo_id = 0;

				gl.genFramebuffers(1, &dst_fbo_id);

				gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_tests[n_current_test].fbo_id);
				gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, dst_fbo_id);

				gl.genTextures(1, &new_dst_to);
				gl.bindTexture(GL_TEXTURE_2D, new_dst_to);
				gl.texStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT);

				GLU_EXPECT_NO_ERROR(gl.getError(),
									"Could not setup texture object for draw framebuffer color attachment.");

				gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, new_dst_to, 0);

				GLU_EXPECT_NO_ERROR(gl.getError(),
									"Could not attach texture object to draw framebuffer color attachment.");

				gl.blitFramebuffer(0, 0, TEXTURE_WIDTH, TEXTURE_HEIGHT, 0, 0, TEXTURE_WIDTH, TEXTURE_HEIGHT,
								   GL_COLOR_BUFFER_BIT, GL_LINEAR);

				GLU_EXPECT_NO_ERROR(gl.getError(), "Error blitting from read framebuffer to draw framebuffer.");

				gl.bindFramebuffer(GL_READ_FRAMEBUFFER, dst_fbo_id);

				gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading attachment's data!");

				gl.bindFramebuffer(GL_FRAMEBUFFER, m_tests[n_current_test].fbo_id);

				gl.deleteFramebuffers(1, &dst_fbo_id);
				gl.deleteTextures(1, &new_dst_to);
			}
			else
			{
				gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, buffer);

				GLU_EXPECT_NO_ERROR(gl.getError(), "Error reading attachment's data!");
			}

			/* Validate it */
			for (; n < TEXTURE_WIDTH * TEXTURE_HEIGHT; ++n)
			{
				unsigned char* data_ptr = buffer + n * TEXTURE_N_COMPONENTS;

				if (memcmp(data_ptr, expected_data, TEXTURE_N_COMPONENTS) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data [" << data_ptr[0] << ", "
									   << data_ptr[1] << ", " << data_ptr[2] << ", " << data_ptr[3]
									   << "] is different from reference data ["
									   << m_layered_rendering_expected_layer_data[0] << ", "
									   << m_layered_rendering_expected_layer_data[1] << ", "
									   << m_layered_rendering_expected_layer_data[2] << ", "
									   << m_layered_rendering_expected_layer_data[3] << "] !"
									   << tcu::TestLog::EndMessage;

					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
					return STOP;
				} /* if (data comparison failed) */
			}	 /* for (all pixels) */
		}		  /* for (all layers) */
	}			  /* for (all iterations) */

	/* Done! */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}